

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tri_seg_intersection
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT *face_nodes,REF_DBL *t,REF_DBL *uvw
          )

{
  REF_NODE ref_node_00;
  REF_DBL *pRVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_DBL node1_volume;
  REF_DBL node0_volume;
  REF_INT nodes [4];
  REF_DBL node2_volume;
  double local_70;
  double local_68;
  REF_INT local_5c;
  REF_INT local_58;
  REF_INT local_54;
  REF_INT local_50;
  REF_INT local_4c;
  REF_NODE local_48;
  REF_DBL *local_40;
  double local_38;
  
  local_58 = *face_nodes;
  local_54 = face_nodes[1];
  local_50 = face_nodes[2];
  local_4c = node0;
  local_40 = uvw;
  uVar2 = ref_node_tet_vol(ref_node,&local_58,&local_68);
  if (uVar2 == 0) {
    local_5c = node1;
    local_4c = node1;
    local_48 = ref_node;
    uVar2 = ref_node_tet_vol(ref_node,&local_58,&local_70);
    ref_node_00 = local_48;
    if (uVar2 == 0) {
      dVar4 = (local_68 - local_70) * 1e+20;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      dVar3 = local_68;
      if (local_68 <= -local_68) {
        dVar3 = -local_68;
      }
      if (dVar3 < dVar4) {
        *t = local_68 / (local_68 - local_70);
        local_4c = local_5c;
        local_50 = node0;
        uVar2 = ref_node_tet_vol(local_48,&local_58,&local_38);
        pRVar1 = local_40;
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa23,"ref_node_tri_seg_intersection",(ulong)uVar2,"face 2 vol");
          return uVar2;
        }
        local_58 = face_nodes[1];
        local_54 = face_nodes[2];
        uVar2 = ref_node_tet_vol(ref_node_00,&local_58,&local_68);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa26,"ref_node_tri_seg_intersection",(ulong)uVar2,"face 20 vol");
          return uVar2;
        }
        local_58 = face_nodes[2];
        local_54 = *face_nodes;
        uVar2 = ref_node_tet_vol(ref_node_00,&local_58,&local_70);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa29,"ref_node_tri_seg_intersection",(ulong)uVar2,"face 1 vol");
          return uVar2;
        }
        dVar3 = local_68 + local_70 + local_38;
        dVar4 = dVar3 * 1e+20;
        if (dVar4 <= -dVar4) {
          dVar4 = -dVar4;
        }
        dVar5 = local_68;
        if (local_68 <= -local_68) {
          dVar5 = -local_68;
        }
        if (dVar5 < dVar4) {
          *pRVar1 = local_68 / dVar3;
          dVar5 = local_70;
          if (local_70 <= -local_70) {
            dVar5 = -local_70;
          }
          if (dVar5 < dVar4) {
            pRVar1[1] = local_70 / dVar3;
            dVar5 = local_38;
            if (local_38 <= -local_38) {
              dVar5 = -local_38;
            }
            if (dVar4 <= dVar5) {
              return 4;
            }
            pRVar1[2] = local_38 / dVar3;
            return 0;
          }
        }
      }
      uVar2 = 4;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa1c,
             "ref_node_tri_seg_intersection",(ulong)uVar2,"node 1 vol");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa1a,
           "ref_node_tri_seg_intersection",(ulong)uVar2,"node 0 vol");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_seg_intersection(REF_NODE ref_node,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT *face_nodes,
                                                 REF_DBL *t, REF_DBL *uvw) {
  REF_DBL node0_volume, node1_volume, node2_volume, total_volume;
  REF_INT nodes[4];
  nodes[0] = face_nodes[0];
  nodes[1] = face_nodes[1];
  nodes[2] = face_nodes[2];
  nodes[3] = node0;
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "node 0 vol");
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "node 1 vol");
  total_volume = node0_volume - node1_volume;
  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  *t = node0_volume / total_volume;

  nodes[2] = node0;
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node2_volume), "face 2 vol");
  nodes[0] = face_nodes[1];
  nodes[1] = face_nodes[2];
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "face 20 vol");
  nodes[0] = face_nodes[2];
  nodes[1] = face_nodes[0];
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "face 1 vol");
  total_volume = node0_volume + node1_volume + node2_volume;

  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  uvw[0] = node0_volume / total_volume;
  if (!ref_math_divisible(node1_volume, total_volume)) return REF_DIV_ZERO;
  uvw[1] = node1_volume / total_volume;
  if (!ref_math_divisible(node2_volume, total_volume)) return REF_DIV_ZERO;
  uvw[2] = node2_volume / total_volume;
  return REF_SUCCESS;
}